

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_utils.cpp
# Opt level: O0

string * resourcePath(string *__return_storage_ptr__,string *resourceRelativePath)

{
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_18;
  string *resourceRelativePath_local;
  
  local_18 = resourceRelativePath;
  resourceRelativePath_local = __return_storage_ptr__;
  std::operator+(&local_38,&TESTS_RESOURCE_LOCATION_abi_cxx11_,"/");
  std::operator+(__return_storage_ptr__,&local_38,local_18);
  std::__cxx11::string::~string((string *)&local_38);
  return __return_storage_ptr__;
}

Assistant:

std::string resourcePath(const std::string &resourceRelativePath)
{
    return TESTS_RESOURCE_LOCATION + "/" + resourceRelativePath;
}